

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLNode * __thiscall tinyxml2::XMLNode::InsertEndChild(XMLNode *this,XMLNode *addThis)

{
  XMLNode *pXVar1;
  
  if (addThis->_document == this->_document) {
    InsertChildPreamble(this,addThis);
    pXVar1 = this->_lastChild;
    if (pXVar1 == (XMLNode *)0x0) {
      this->_lastChild = addThis;
      this->_firstChild = addThis;
      addThis->_prev = (XMLNode *)0x0;
      addThis->_next = (XMLNode *)0x0;
    }
    else {
      pXVar1->_next = addThis;
      addThis->_prev = pXVar1;
      this->_lastChild = addThis;
      addThis->_next = (XMLNode *)0x0;
    }
    addThis->_parent = this;
  }
  else {
    addThis = (XMLNode *)0x0;
  }
  return addThis;
}

Assistant:

XMLNode* XMLNode::InsertEndChild( XMLNode* addThis )
{
    TIXMLASSERT( addThis );
    if ( addThis->_document != _document ) {
        TIXMLASSERT( false );
        return 0;
    }
    InsertChildPreamble( addThis );

    if ( _lastChild ) {
        TIXMLASSERT( _firstChild );
        TIXMLASSERT( _lastChild->_next == 0 );
        _lastChild->_next = addThis;
        addThis->_prev = _lastChild;
        _lastChild = addThis;

        addThis->_next = 0;
    }
    else {
        TIXMLASSERT( _firstChild == 0 );
        _firstChild = _lastChild = addThis;

        addThis->_prev = 0;
        addThis->_next = 0;
    }
    addThis->_parent = this;
    return addThis;
}